

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionHandler.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGL3ExtensionHandler::initExtensionsNew(COpenGL3ExtensionHandler *this)

{
  GLubyte *__s;
  GLuint GVar1;
  GLuint GVar2;
  GLint val;
  allocator<char> local_59;
  COpenGL3ExtensionHandler *local_58;
  GLuint local_50 [8];
  
  local_50[0] = 0;
  (*GL.GetIntegerv)(0x821d,(GLint *)local_50);
  GVar2 = 0;
  GVar1 = local_50[0];
  if ((int)local_50[0] < 1) {
    GVar1 = 0;
  }
  local_58 = this;
  for (; GVar1 != GVar2; GVar2 = GVar2 + 1) {
    __s = (*GL.GetStringi)(0x1f03,GVar2);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)local_50,(char *)__s,&local_59);
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_M_emplace<std::__cxx11::string>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->Extensions,(string *)local_50);
    ::std::__cxx11::string::_M_dispose();
  }
  extensionsLoaded(local_58);
  return;
}

Assistant:

void COpenGL3ExtensionHandler::initExtensionsNew()
{
	int ext_count = GetInteger(GL_NUM_EXTENSIONS);
	for (int k = 0; k < ext_count; k++)
		addExtension(reinterpret_cast<const char *>(GL.GetStringi(GL_EXTENSIONS, k)));
	extensionsLoaded();
}